

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase523::run(TestCase523 *this)

{
  bool bVar1;
  char *__s;
  ArrayPtr<const_unsigned_char> AVar2;
  ArrayPtr<const_unsigned_char> packedBytes;
  ReaderOptions options;
  bool local_3f9;
  undefined1 local_3f8 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_3c8;
  ArrayPtr<const_char> local_3b8;
  undefined1 local_3a8 [8];
  DebugComparison<capnp::Text::Reader,_kj::String_&> _kjCondition_1;
  ReaderOptions local_368;
  undefined1 local_358 [8];
  PackedMessageReader reader;
  size_t local_210;
  size_t local_208;
  bool local_1f9;
  undefined1 auStack_1f8 [7];
  bool _kj_shouldLog;
  size_t local_1f0;
  size_t local_1e8;
  size_t local_1e0;
  DebugExpression<unsigned_long> local_1d8;
  undefined1 local_1d0 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  TestPipe pipe;
  Builder local_158;
  undefined1 local_130 [8];
  TestMessageBuilder builder;
  undefined1 local_28 [8];
  String huge;
  TestCase523 *this_local;
  
  huge.content.disposer = (ArrayDisposer *)this;
  kj::heapString((String *)local_28,0x139f);
  __s = kj::String::begin((String *)local_28);
  memset(__s,0x78,0x139f);
  TestMessageBuilder::TestMessageBuilder((TestMessageBuilder *)local_130,3);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_158,(MessageBuilder *)local_130);
  Text::Reader::Reader((Reader *)&pipe.readPos,(String *)local_28);
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            (&local_158,(Reader)stack0xfffffffffffffe98);
  TestPipe::TestPipe((TestPipe *)&_kjCondition.result);
  writePackedMessage((OutputStream *)&pipe,(MessageBuilder *)local_130);
  local_1e0 = computeSerializedSizeInWords((MessageBuilder *)local_130);
  local_1d8 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1e0);
  _auStack_1f8 = TestPipe::getArray((TestPipe *)&_kjCondition.result);
  AVar2.size_ = (uchar *)auStack_1f8._8_8_;
  AVar2.ptr = AVar2.size_;
  local_1e8 = computeUnpackedSizeInWords((capnp *)auStack_1f8._0_8_,AVar2);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_1d0,&local_1d8,&local_1e8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d0);
  if (!bVar1) {
    local_1f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f9 != false) {
      local_208 = computeSerializedSizeInWords((MessageBuilder *)local_130);
      AVar2 = TestPipe::getArray((TestPipe *)&_kjCondition.result);
      packedBytes.size_ = (uchar *)AVar2.size_;
      reader.super_InputStreamMessageReader._288_8_ = AVar2.ptr;
      packedBytes.ptr = packedBytes.size_;
      local_210 = computeUnpackedSizeInWords
                            ((capnp *)reader.super_InputStreamMessageReader._288_8_,packedBytes);
      kj::_::Debug::
      log<char_const(&)[106],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
                 ,0x215,ERROR,
                 "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", _kjCondition, computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
                 ,(char (*) [106])
                  "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
                 ,(DebugComparison<unsigned_long,_unsigned_long> *)local_1d0,&local_208,&local_210);
      local_1f9 = false;
    }
  }
  local_368.traversalLimitInWords = 0;
  local_368.nestingLimit = 0;
  local_368._12_4_ = 0;
  ReaderOptions::ReaderOptions(&local_368);
  kj::ArrayPtr<capnp::word>::ArrayPtr((ArrayPtr<capnp::word> *)&_kjCondition_1.result,(void *)0x0);
  options.nestingLimit = local_368.nestingLimit;
  options.traversalLimitInWords = local_368.traversalLimitInWords;
  options._12_4_ = 0;
  PackedMessageReader::PackedMessageReader
            ((PackedMessageReader *)local_358,(BufferedInputStream *)&_kjCondition.result,options,
             stack0xfffffffffffffc88);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Reader *)local_3f8,(MessageReader *)&reader.super_PackedInputStream.inner);
  local_3c8 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField((Reader *)local_3f8);
  local_3b8 = (ArrayPtr<const_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_3c8);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_kj::String_&> *)local_3a8,
             (DebugExpression<capnp::Text::Reader> *)&local_3b8,(String *)local_28);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3a8);
  if (!bVar1) {
    local_3f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_3f9 != false) {
      kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<capnp::Text::Reader,kj::String&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
                 ,0x218,ERROR,
                 "\"failed: expected \" \"reader.getRoot<TestAllTypes>().getTextField() == huge\", _kjCondition"
                 ,(char (*) [71])
                  "failed: expected reader.getRoot<TestAllTypes>().getTextField() == huge",
                 (DebugComparison<capnp::Text::Reader,_kj::String_&> *)local_3a8);
      local_3f9 = false;
    }
  }
  PackedMessageReader::~PackedMessageReader((PackedMessageReader *)local_358);
  TestPipe::~TestPipe((TestPipe *)&_kjCondition.result);
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)local_130);
  kj::String::~String((String *)local_28);
  return;
}

Assistant:

TEST(Packed, RoundTripHugeStringOddSegmentCount) {
  kj::String huge = kj::heapString(5023);
  memset(huge.begin(), 'x', 5023);

  TestMessageBuilder builder(3);
  builder.initRoot<TestAllTypes>().setTextField(huge);

  TestPipe pipe;
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  PackedMessageReader reader(pipe);
  EXPECT_TRUE(reader.getRoot<TestAllTypes>().getTextField() == huge);
}